

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyMemBackendFree(SyMemBackend *pBackend,void *pChunk)

{
  sxi32 rc;
  void *pChunk_local;
  SyMemBackend *pBackend_local;
  
  if (pChunk == (void *)0x0) {
    pBackend_local._4_4_ = 0;
  }
  else {
    if ((pBackend->pMutexMethods != (SyMutexMethods *)0x0) && (pBackend->pMutex != (SyMutex *)0x0))
    {
      (*pBackend->pMutexMethods->xEnter)(pBackend->pMutex);
    }
    pBackend_local._4_4_ = MemBackendFree(pBackend,pChunk);
    if ((pBackend->pMutexMethods != (SyMutexMethods *)0x0) && (pBackend->pMutex != (SyMutex *)0x0))
    {
      (*pBackend->pMutexMethods->xLeave)(pBackend->pMutex);
    }
  }
  return pBackend_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 SyMemBackendFree(SyMemBackend *pBackend, void * pChunk)
{
	sxi32 rc;
#if defined(UNTRUST)
	if( SXMEM_BACKEND_CORRUPT(pBackend) ){
		return SXERR_CORRUPT;
	}
#endif
	if( pChunk == 0 ){
		return SXRET_OK;
	}
	if( pBackend->pMutexMethods ){
		SyMutexEnter(pBackend->pMutexMethods, pBackend->pMutex);
	}
	rc = MemBackendFree(&(*pBackend), pChunk);
	if( pBackend->pMutexMethods ){
		SyMutexLeave(pBackend->pMutexMethods, pBackend->pMutex);
	}
	return rc;
}